

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::
         do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  uint uVar1;
  long lVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar3;
  appender aVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char cVar10;
  float_specs fVar11;
  char *pcVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  float_specs fVar16;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_e6 [34];
  undefined1 local_c4 [8];
  int iStack_bc;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0;
  significand_type *local_98;
  basic_format_specs<char> *local_90;
  decimal_fp<double> *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  int local_68;
  char cStack_64;
  undefined3 uStack_63;
  undefined8 local_60;
  digit_grouping<char> *local_58;
  digit_grouping<char> *local_50;
  int *local_48;
  int *local_40;
  char *local_38;
  
  local_e6._22_8_ = fp->significand;
  lVar13 = 0x3f;
  if ((local_e6._22_8_ | 1) != 0) {
    for (; (local_e6._22_8_ | 1) >> lVar13 == 0; lVar13 = lVar13 + -1) {
    }
  }
  iVar6 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar13] -
          (uint)((ulong)local_e6._22_8_ <
                *(significand_type **)
                 (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                 (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar13] * 8));
  local_e6[1] = 0x30;
  uVar1 = fspecs._4_4_;
  local_e6._10_4_ = uVar1 >> 8 & 0xff;
  fVar11.precision = (uint)(local_e6._10_4_ != 0) + iVar6;
  fVar11._4_4_ = 0;
  local_e6[0] = '.';
  local_78._8_8_ = local_e6._22_8_;
  fVar16 = fspecs;
  local_e6._6_4_ = iVar6;
  local_80 = (undefined1  [8])fspecs;
  if ((uVar1 >> 0x11 & 1) != 0) {
    local_e6._14_8_ = fspecs;
    local_98 = (significand_type *)local_e6._22_8_;
    local_90 = specs;
    local_88 = fp;
    local_e6[0] = decimal_point_impl<char>(loc);
    specs = local_90;
    local_78._8_8_ = local_98;
    fp = local_88;
    fVar16 = (float_specs)local_e6._14_8_;
  }
  uVar15 = fp->exponent;
  local_c4._0_4_ = iVar6 + uVar15;
  iVar14 = fVar16.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0014396f:
    iVar7 = iVar6 + uVar15 + -1;
    if ((uVar1 >> 0x14 & 1) == 0) {
      uVar8 = 0;
      if (iVar6 == 1) {
        local_e6[0] = '\0';
        uVar8 = 0;
      }
    }
    else {
      uVar8 = 0;
      if (0 < iVar14 - iVar6) {
        uVar8 = (ulong)(uint)(iVar14 - iVar6);
      }
      fVar11 = (float_specs)((long)fVar11 + uVar8);
    }
    local_78._0_8_ = CONCAT44(local_78._4_4_,uVar1 >> 8) & 0xffffffff000000ff;
    cStack_64 = local_e6[0];
    local_68 = iVar6;
    local_60._0_5_ = CONCAT14('0',(int)uVar8);
    local_60 = (decimal_fp<double> *)
               (CONCAT26(local_60._6_2_,
                         CONCAT15(((uVar1 >> 0x10 & 1) == 0) << 5,(undefined5)local_60)) |
               0x450000000000);
    local_58 = (digit_grouping<char> *)CONCAT44(local_58._4_4_,iVar7);
    if (0 < specs->width) {
      if ((int)local_c4._0_4_ < 1) {
        iVar7 = 1 - local_c4._0_4_;
      }
      lVar13 = 2;
      if (99 < iVar7) {
        lVar13 = (ulong)(999 < iVar7) + 3;
      }
      sVar5 = (long)fVar11 + (3 - (ulong)(local_e6[0] == '\0')) + lVar13;
      aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                        (out,specs,sVar5,sVar5,(anon_class_40_8_dbbf3351 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
    aVar4 = do_write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<double>,_char,_fmt::v8::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()
                      ((anon_class_40_8_dbbf3351 *)local_78,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
           aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar7 = 0x10;
    if (0 < iVar14) {
      iVar7 = iVar14;
    }
    if (((int)local_c4._0_4_ < -3) || (iVar7 < (int)local_c4._0_4_)) goto LAB_0014396f;
  }
  if ((int)uVar15 < 0) {
    if ((int)local_c4._0_4_ < 1) {
      iVar7 = -local_c4._0_4_;
      local_c4._4_4_ = iVar7;
      if (SBORROW4(iVar14,iVar7) != iVar14 + local_c4._0_4_ < 0) {
        local_c4._4_4_ = iVar14;
      }
      if (iVar14 < 0) {
        local_c4._4_4_ = iVar7;
      }
      if (iVar6 != 0) {
        local_c4._4_4_ = iVar7;
      }
      if (iVar6 == 0 && local_c4._4_4_ == 0) {
        local_e6[2] = (char)((uVar1 & 0x100000) >> 0x14);
        iVar6 = 1;
        if (((ulong)fspecs & 0x10000000000000) == 0) goto LAB_00143cca;
      }
      else {
        local_e6[2] = 1;
      }
      iVar6 = 2;
LAB_00143cca:
      sVar5 = (ulong)(uint)(iVar6 + local_c4._4_4_) + (long)fVar11;
      local_78._0_8_ = local_e6 + 10;
      local_78._8_8_ = local_e6 + 1;
      _local_68 = local_e6 + 2;
      local_60 = (decimal_fp<double> *)local_e6;
      local_58 = (digit_grouping<char> *)(local_c4 + 4);
      local_50 = (digit_grouping<char> *)(local_e6 + 0x16);
      local_48 = (int *)(local_e6 + 6);
      aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_&>
                        (out,specs,sVar5,sVar5,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
    iVar7 = 0;
    local_e6._2_4_ = iVar14 - iVar6 & (int)(uVar1 << 0xb) >> 0x1f;
    uVar15 = local_e6._2_4_;
    if ((int)local_e6._2_4_ < 1) {
      uVar15 = 0;
    }
    local_e6._14_8_ = fVar11;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)(local_c4 + 4),loc,(bool)((byte)(uVar1 >> 0x11) & 1));
    if (local_a0 != '\0') {
      pcVar9 = (char *)CONCAT44(iStack_bc,local_c4._4_4_);
      pcVar12 = pcVar9 + local_b8;
      lVar13 = 0;
      do {
        if (pcVar9 == pcVar12) {
          cVar10 = pcVar12[-1];
          pcVar9 = pcVar12;
        }
        else {
          cVar10 = *pcVar9;
          if ((byte)(cVar10 + 0x81U) < 0x82) goto LAB_00143c29;
          pcVar9 = pcVar9 + 1;
        }
        iVar7 = iVar7 + cVar10;
        if ((int)local_e6._6_4_ <= iVar7) goto LAB_00143c29;
        lVar13 = lVar13 + 1;
      } while( true );
    }
    lVar13 = 0;
LAB_00143c29:
    sVar5 = (ulong)uVar15 + local_e6._14_8_ + lVar13 + 1;
    local_78._0_8_ = local_e6 + 10;
    local_78._8_8_ = local_e6 + 0x16;
    _local_68 = local_e6 + 6;
    local_60 = (decimal_fp<double> *)local_c4;
    local_58 = (digit_grouping<char> *)local_e6;
    local_48 = (int *)(local_e6 + 2);
    local_40 = (int *)(local_e6 + 1);
    local_50 = (digit_grouping<char> *)(local_c4 + 4);
    bVar3.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_&>
                   (out,specs,sVar5,sVar5,(anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_00143c89;
  }
  lVar13 = (ulong)uVar15 + (long)fVar11;
  local_e6._2_4_ = iVar14 - local_c4._0_4_;
  if ((uVar1 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_e6._2_4_) {
      if ((int)local_e6._2_4_ < 1) goto LAB_00143b2a;
    }
    else {
      local_e6._2_4_ = 1;
    }
    lVar13 = lVar13 + (ulong)(uint)local_e6._2_4_ + 1;
  }
LAB_00143b2a:
  digit_grouping<char>::digit_grouping
            ((digit_grouping<char> *)(local_c4 + 4),loc,(bool)((byte)(uVar1 >> 0x11) & 1));
  iVar6 = 0;
  if (local_a0 != '\0') {
    pcVar9 = (char *)CONCAT44(iStack_bc,local_c4._4_4_);
    pcVar12 = pcVar9 + local_b8;
    lVar2 = 0;
    do {
      if (pcVar9 == pcVar12) {
        cVar10 = pcVar12[-1];
        pcVar9 = pcVar12;
      }
      else {
        cVar10 = *pcVar9;
        if ((byte)(cVar10 + 0x81U) < 0x82) goto LAB_00143b94;
        pcVar9 = pcVar9 + 1;
      }
      iVar6 = iVar6 + cVar10;
      if ((int)local_e6._6_4_ <= iVar6) goto LAB_00143b94;
      lVar2 = lVar2 + 1;
    } while( true );
  }
  lVar2 = 0;
LAB_00143b94:
  local_78._0_8_ = local_e6 + 10;
  local_78._8_8_ = local_e6 + 0x16;
  _local_68 = local_e6 + 6;
  local_50 = (digit_grouping<char> *)local_80;
  local_48 = (int *)local_e6;
  local_40 = (int *)(local_e6 + 2);
  local_38 = local_e6 + 1;
  local_60 = fp;
  local_58 = (digit_grouping<char> *)(local_c4 + 4);
  bVar3.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_&>
                 (out,specs,lVar13 + lVar2,lVar13 + lVar2,(anon_class_72_9_d68ba176 *)local_78);
LAB_00143c89:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iStack_bc,local_c4._4_4_) != &local_b0) {
    operator_delete((undefined1 *)CONCAT44(iStack_bc,local_c4._4_4_),
                    local_b0._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}